

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int64 __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32 first_byte_or_zero)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  LogMessage *pLVar4;
  byte *pbVar5;
  pair<bool,_const_unsigned_char_*> pVar6;
  ulong local_1b8;
  uint local_15c [2];
  uint32 temp_1;
  pair<bool,_const_unsigned_char_*> p;
  LogFinisher local_13d;
  uint32 temp;
  byte local_129;
  LogMessage local_128;
  uint local_ec;
  CodedInputStream *pCStack_e8;
  uint32 first_byte_or_zero_local;
  CodedInputStream *this_local;
  bool local_d6;
  bool local_d5;
  int local_d4;
  int local_d0;
  int i;
  uint32 result;
  uint32 b;
  uint8 *ptr;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  int *local_30;
  byte *local_28;
  uint local_1c;
  byte local_18;
  uint8 *local_10;
  
  local_ec = first_byte_or_zero;
  pCStack_e8 = this;
  iVar3 = BufferSize(this);
  if ((iVar3 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    bVar2 = ReadVarint32Slow(this,local_15c);
    if (bVar2) {
      local_1b8 = (ulong)local_15c[0];
    }
    else {
      local_1b8 = 0xffffffffffffffff;
    }
    return local_1b8;
  }
  local_129 = 0;
  if (local_ec == 0) {
    internal::LogMessage::LogMessage
              (&local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1a7);
    local_129 = 1;
    pLVar4 = internal::LogMessage::operator<<
                       (&local_128,"CHECK failed: (first_byte_or_zero) != (0): ");
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,"Caller should provide us with *buffer_ when buffer is non-empty");
    internal::LogFinisher::operator=(&local_13d,pLVar4);
  }
  if ((local_129 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_128);
  }
  local_28 = this->buffer_;
  local_1c = local_ec;
  local_30 = (int *)((long)&p.second + 4);
  local_69 = 0;
  if (*local_28 != local_ec) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x14f);
    local_69 = 1;
    pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (*buffer) == (first_byte): ")
    ;
    internal::LogFinisher::operator=(local_7d,pLVar4);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  ptr._7_1_ = 0;
  if ((local_1c & 0x80) != 0x80) {
    internal::LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x150);
    ptr._7_1_ = 1;
    pLVar4 = internal::LogMessage::operator<<
                       (&local_b8,"CHECK failed: (first_byte & 0x80) == (0x80): ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,local_1c);
    internal::LogFinisher::operator=((LogFinisher *)((long)&ptr + 6),pLVar4);
  }
  if ((ptr._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_b8);
  }
  _result = local_28 + 2;
  i = (int)local_28[1];
  local_d0 = i * 0x80 + (local_1c - 0x80);
  if ((local_28[1] & 0x80) != 0) {
    bVar1 = *_result;
    i = (int)bVar1;
    local_d0 = i * 0x4000 + local_d0 + -0x4000;
    _result = local_28 + 3;
    if ((bVar1 & 0x80) != 0) {
      bVar1 = local_28[3];
      i = (int)bVar1;
      local_d0 = i * 0x200000 + local_d0 + -0x200000;
      _result = local_28 + 4;
      if ((bVar1 & 0x80) != 0) {
        bVar1 = local_28[4];
        i = (int)bVar1;
        local_d0 = i * 0x10000000 + local_d0 + -0x10000000;
        _result = local_28 + 5;
        if ((bVar1 & 0x80) != 0) {
          for (local_d4 = 0; local_d4 < 5; local_d4 = local_d4 + 1) {
            pbVar5 = _result + 1;
            bVar1 = *_result;
            i = (int)bVar1;
            _result = pbVar5;
            if ((bVar1 & 0x80) == 0) goto LAB_0049fa93;
          }
          local_d5 = false;
          pVar6 = std::make_pair<bool,unsigned_char_const*&>(&local_d5,(uchar **)&result);
          local_10 = pVar6.second;
          local_18 = pVar6.first;
          goto LAB_0049fad2;
        }
      }
    }
  }
LAB_0049fa93:
  *local_30 = local_d0;
  local_d6 = true;
  pVar6 = std::make_pair<bool,unsigned_char_const*&>(&local_d6,(uchar **)&result);
  local_10 = pVar6.second;
  local_18 = pVar6.first;
LAB_0049fad2:
  if ((local_18 & 1) == 0) {
    this_local = (CodedInputStream *)0xffffffffffffffff;
  }
  else {
    this->buffer_ = local_10;
    this_local = (CodedInputStream *)(ulong)p.second._4_4_;
  }
  return (int64)this_local;
}

Assistant:

int64 CodedInputStream::ReadVarint32Fallback(uint32 first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    GOOGLE_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32 temp;
    ::std::pair<bool, const uint8*> p =
          ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32 temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64>(temp) : -1;
  }
}